

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

void __thiscall Fl_Browser::icon(Fl_Browser *this,int line,Fl_Image *icon)

{
  int iVar1;
  FL_BLINE *item;
  int iVar2;
  int iVar3;
  
  if ((0 < line) && (line <= this->lines)) {
    item = find_line(this,line);
    iVar2 = 0;
    iVar3 = 0;
    if (item->icon != (Fl_Image *)0x0) {
      iVar3 = item->icon->h_ + 2;
    }
    item->icon = (Fl_Image *)0x0;
    iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,item);
    if (icon != (Fl_Image *)0x0) {
      iVar2 = icon->h_ + 2;
    }
    if (iVar3 < iVar1) {
      iVar3 = iVar1;
    }
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    this->full_height_ = this->full_height_ + (iVar2 - iVar3);
    item->icon = icon;
    if (iVar2 - iVar3 < 1) {
      Fl_Browser_::redraw_line(&this->super_Fl_Browser_,item);
    }
    else {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    Fl_Browser_::replacing(&this->super_Fl_Browser_,item,item);
    return;
  }
  return;
}

Assistant:

void Fl_Browser::icon(int line, Fl_Image* icon) {

  if (line<1 || line > lines) return;

  FL_BLINE* bl = find_line(line);

  int old_h = bl->icon ? bl->icon->h()+2 : 0;	// init with *old* icon height
  bl->icon = 0;					// remove icon, if any
  int th = item_height(bl);			// height of text only
  int new_h = icon ? icon->h()+2 : 0;		// init with *new* icon height
  if (th > old_h) old_h = th;
  if (th > new_h) new_h = th;
  int dh = new_h - old_h;
  full_height_ += dh;				// do this *always*

  bl->icon = icon;				// set new icon
  if (dh>0) {
    redraw();					// icon larger than item? must redraw widget
  } else {
    redraw_line(bl);				// icon same or smaller? can redraw just this line
  }
  replacing(bl,bl);				// recalc Fl_Browser_::max_width et al
}